

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tap.c
# Opt level: O0

int cmp_mem_at_loc(char *file,int line,void *got,void *expected,size_t n,char *fmt,...)

{
  char in_AL;
  int iVar1;
  char *pcVar2;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_118 [48];
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined1 local_68 [8];
  va_list args;
  size_t sStack_40;
  int diff;
  size_t offset;
  char *fmt_local;
  size_t n_local;
  void *expected_local;
  void *got_local;
  char *pcStack_10;
  int line_local;
  char *file_local;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  offset = (size_t)fmt;
  fmt_local = (char *)n;
  n_local = (size_t)expected;
  expected_local = got;
  got_local._4_4_ = line;
  pcStack_10 = file;
  iVar1 = find_mem_diff((char *)got,(char *)expected,n,&stack0xffffffffffffffc0);
  args[0].overflow_arg_area = local_118;
  args[0]._0_8_ = &stack0x00000008;
  local_68._4_4_ = 0x30;
  local_68._0_4_ = 0x30;
  vok_at_loc(pcStack_10,got_local._4_4_,(uint)((iVar1 != 0 ^ 0xffU) & 1),(char *)offset,
             (__va_list_tag *)local_68);
  if (iVar1 == 1) {
    diag("    Difference starts at offset %d",sStack_40);
    diag("         got: 0x%02x",(ulong)*(byte *)((long)expected_local + sStack_40));
    diag("    expected: 0x%02x",(ulong)*(byte *)(n_local + sStack_40));
  }
  else if (iVar1 == 2) {
    pcVar2 = "NULL";
    if (expected_local != (void *)0x0) {
      pcVar2 = "not NULL";
    }
    diag("         got: %s",pcVar2);
    pcVar2 = "NULL";
    if (n_local != 0) {
      pcVar2 = "not NULL";
    }
    diag("    expected: %s",pcVar2);
  }
  return (int)(iVar1 == 0);
}

Assistant:

int
cmp_mem_at_loc (const char *file, int line, const void *got,
                const void *expected, size_t n, const char *fmt, ...)
{
    size_t offset;
    int diff = find_mem_diff(got, expected, n, &offset);
    va_list args;
    va_start(args, fmt);
    vok_at_loc(file, line, !diff, fmt, args);
    va_end(args);
    if (diff == 1) {
        diag("    Difference starts at offset %d", offset);
        diag("         got: 0x%02x", ((const unsigned char *)got)[offset]);
        diag("    expected: 0x%02x", ((const unsigned char *)expected)[offset]);
    }
    else if (diff == 2) {
        diag("         got: %s", got ? "not NULL" : "NULL");
        diag("    expected: %s", expected ? "not NULL" : "NULL");
    }
    return !diff;
}